

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_modmul(mp_int *x,mp_int *y,mp_int *modulus)

{
  mp_int *n;
  mp_int *pmVar1;
  mp_int *reduced;
  mp_int *product;
  mp_int *modulus_local;
  mp_int *y_local;
  mp_int *x_local;
  
  n = mp_mul(x,y);
  pmVar1 = mp_mod(n,modulus);
  mp_free(n);
  return pmVar1;
}

Assistant:

mp_int *mp_modmul(mp_int *x, mp_int *y, mp_int *modulus)
{
    mp_int *product = mp_mul(x, y);
    mp_int *reduced = mp_mod(product, modulus);
    mp_free(product);
    return reduced;
}